

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O2

void __thiscall
mjs::test_spec_runner::check_test_spec_done(test_spec_runner *this,uint32_t check_pos)

{
  value *l;
  completion_type cVar1;
  uint uVar2;
  size_t sVar3;
  element_type *peVar4;
  bool bVar5;
  wostream *pwVar6;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar7;
  value *v;
  value *v_00;
  value *v_01;
  pointer ptVar8;
  wstring local_1d8;
  wstring local_1b8;
  wostringstream oss;
  
  sVar3 = this->index_;
  ptVar8 = (this->specs_->super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((sVar3 != ((long)(this->specs_->
                       super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ptVar8) / 0x48) &&
     (ptVar8[sVar3].position < check_pos)) {
    ptVar8 = ptVar8 + sVar3;
    cVar1 = (this->last_result_).type;
    if ((cVar1 != normal) && (cVar1 != return_)) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&oss);
      peVar4 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pwVar6 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         ((wostream *)&oss,(peVar4->filename_)._M_dataplus._M_p,
                          (peVar4->filename_)._M_string_length);
      pwVar6 = std::operator<<(pwVar6," failed: ");
      pwVar6 = mjs::operator<<(pwVar6,&(this->last_result_).type);
      pwVar6 = std::operator<<(pwVar6," ");
      debug_string_abi_cxx11_(&local_1d8,(mjs *)&(this->last_result_).result,v_01);
      pwVar6 = std::operator<<(pwVar6,(wstring *)&local_1d8);
      pwVar6 = std::operator<<(pwVar6," at ");
      pbVar7 = mjs::operator<<(pwVar6,&ptVar8->extend);
      pwVar6 = std::operator<<(pbVar7,"\n");
      uVar2 = (ptVar8->extend).start;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar6,(((ptVar8->extend).file.
                          super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_)._M_dataplus._M_p + uVar2,(ulong)((ptVar8->extend).end - uVar2));
      std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
      std::__cxx11::wstringbuf::str();
      local_1b8._M_dataplus._M_p = (pointer)local_1d8._M_string_length;
      local_1b8._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
      throw_runtime_error((wstring_view *)&local_1b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd3);
    }
    l = &(this->last_result_).result;
    bVar5 = operator!=(l,&ptVar8->expected);
    if (bVar5) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&oss);
      pwVar6 = std::operator<<((wostream *)&oss,"Expecting\n");
      debug_string_abi_cxx11_
                (&local_1d8,
                 (mjs *)&(this->specs_->
                         super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>).
                         _M_impl.super__Vector_impl_data._M_start[this->index_].expected,v);
      pwVar6 = std::operator<<(pwVar6,(wstring *)&local_1d8);
      pwVar6 = std::operator<<(pwVar6,"\ngot\n");
      debug_string_abi_cxx11_(&local_1b8,(mjs *)l,v_00);
      pwVar6 = std::operator<<(pwVar6,(wstring *)&local_1b8);
      pwVar6 = std::operator<<(pwVar6,"\nat ");
      pbVar7 = mjs::operator<<(pwVar6,&ptVar8->extend);
      pwVar6 = std::operator<<(pbVar7,"\n");
      uVar2 = (ptVar8->extend).start;
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar6,(((ptVar8->extend).file.
                          super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_)._M_dataplus._M_p + uVar2,(ulong)((ptVar8->extend).end - uVar2));
      std::__cxx11::wstring::~wstring((wstring *)&local_1b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_1d8);
      std::__cxx11::wstringbuf::str();
      local_1b8._M_dataplus._M_p = (pointer)local_1d8._M_string_length;
      local_1b8._M_string_length = (size_type)local_1d8._M_dataplus._M_p;
      throw_runtime_error((wstring_view *)&local_1b8,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                          ,0xd8);
    }
    this->index_ = this->index_ + 1;
  }
  return;
}

Assistant:

void check_test_spec_done(uint32_t check_pos) {
        if (index_ == specs_.size()) {
            return;
        }
        const auto& s = specs_[index_];

        if (check_pos > s.position) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << check_pos << ": Checking pos " << pos_w << s.position << " at " << s.extend << " expecting " << debug_string(s.expected) << "\n";
#endif
            if (last_result_ && last_result_.type != completion_type::return_) { // Allow return for the sake of function expressions
                std::wostringstream oss;
                oss << source_->filename() << " failed: " << last_result_.type << " " << debug_string(last_result_.result) << " at " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            if (last_result_.result != specs_[index_].expected) {
                std::wostringstream oss;
                oss << "Expecting\n" << debug_string(specs_[index_].expected) << "\ngot\n" << debug_string(last_result_.result) << "\nat " << s.extend << "\n" << s.extend.source_view();
                THROW_RUNTIME_ERROR(oss.str());
            }
            ++index_;
        }
    }